

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::WriteTableRecord(Table *table,size_t *offset,uint8_t *dst,size_t dst_size)

{
  uint32_t uVar1;
  size_t sVar2;
  size_t sVar3;
  Table *pTVar4;
  
  sVar2 = *offset;
  if (sVar2 + 0x10 <= dst_size) {
    pTVar4 = table->reuse_of;
    if (table->reuse_of == (Table *)0x0) {
      pTVar4 = table;
    }
    uVar1 = pTVar4->tag;
    *offset = sVar2 + 1;
    dst[sVar2] = (uint8_t)(uVar1 >> 0x18);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x10);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 8);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)uVar1;
    uVar1 = pTVar4->checksum;
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x18);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x10);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 8);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)uVar1;
    uVar1 = pTVar4->offset;
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x18);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x10);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 8);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)uVar1;
    uVar1 = pTVar4->length;
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x18);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 0x10);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)(uVar1 >> 8);
    sVar3 = *offset;
    *offset = sVar3 + 1;
    dst[sVar3] = (uint8_t)uVar1;
  }
  return sVar2 + 0x10 <= dst_size;
}

Assistant:

bool WriteTableRecord(const Font::Table* table, size_t* offset, uint8_t* dst,
                      size_t dst_size) {
  if (dst_size < *offset + kSfntEntrySize) {
    return FONT_COMPRESSION_FAILURE();
  }
  if (table->IsReused()) {
    table = table->reuse_of;
  }
  StoreU32(table->tag, offset, dst);
  StoreU32(table->checksum, offset, dst);
  StoreU32(table->offset, offset, dst);
  StoreU32(table->length, offset, dst);
  return true;
}